

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outrec)

{
  OutRec *pOVar1;
  byte bVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  TEdge *pTVar5;
  
  pTVar3 = e->PrevInAEL;
  if (pTVar3 == (TEdge *)0x0) {
    pTVar4 = (TEdge *)0x0;
  }
  else {
    pTVar5 = (TEdge *)0x0;
    do {
      pTVar4 = pTVar5;
      if ((((-1 < pTVar3->OutIdx) && (pTVar3->WindDelta != 0)) &&
          (pTVar4 = pTVar3, pTVar5 != (TEdge *)0x0)) &&
         (pTVar4 = (TEdge *)0x0, pTVar5->OutIdx != pTVar3->OutIdx)) {
        pTVar4 = pTVar5;
      }
      pTVar3 = pTVar3->PrevInAEL;
      pTVar5 = pTVar4;
    } while (pTVar3 != (TEdge *)0x0);
  }
  if (pTVar4 == (TEdge *)0x0) {
    outrec->FirstLeft = (OutRec *)0x0;
    bVar2 = false;
  }
  else {
    pOVar1 = *(OutRec **)
              (*(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) +
              (long)pTVar4->OutIdx * 8);
    outrec->FirstLeft = pOVar1;
    bVar2 = pOVar1->IsHole ^ 1;
  }
  outrec->IsHole = (bool)bVar2;
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outrec)
{
  TEdge *e2 = e->PrevInAEL;
  TEdge *eTmp = 0;
  while (e2)
  {
    if (e2->OutIdx >= 0 && e2->WindDelta != 0)
    {
      if (!eTmp) eTmp = e2;
      else if (eTmp->OutIdx == e2->OutIdx) eTmp = 0;        
    }
    e2 = e2->PrevInAEL;
  }
  if (!eTmp)
  {
    outrec->FirstLeft = 0;
    outrec->IsHole = false;
  }
  else
  {
    outrec->FirstLeft = m_PolyOuts[eTmp->OutIdx];
    outrec->IsHole = !outrec->FirstLeft->IsHole;
  }
}